

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_free(archive_write *a)

{
  void *__ptr;
  pax *in_RDI;
  pax *pax;
  
  __ptr = (void *)in_RDI[1].sparse_map.buffer_length;
  if (__ptr != (void *)0x0) {
    archive_string_free((archive_string *)0x1a3a97);
    archive_string_free((archive_string *)0x1a3aa4);
    archive_string_free((archive_string *)0x1a3ab1);
    sparse_list_clear(in_RDI);
    free(__ptr);
    in_RDI[1].sparse_map.buffer_length = 0;
  }
  return 0;
}

Assistant:

static int
archive_write_pax_free(struct archive_write *a)
{
	struct pax *pax;

	pax = (struct pax *)a->format_data;
	if (pax == NULL)
		return (ARCHIVE_OK);

	archive_string_free(&pax->pax_header);
	archive_string_free(&pax->sparse_map);
	archive_string_free(&pax->l_url_encoded_name);
	sparse_list_clear(pax);
	free(pax);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}